

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

secplane_t * P_CheckSlopeWalk(AActor *actor,DVector2 *move)

{
  F3DFloor *pFVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  xfloor *pxVar5;
  F3DFloor **ppFVar6;
  secplane_t *psVar7;
  double dVar8;
  double dVar9;
  secplane_t *local_338;
  secplane_t *local_330;
  secplane_t *local_328;
  secplane_t *local_310;
  DVector3 local_2e0;
  undefined1 local_2c8 [32];
  DVector3 local_2a8;
  TVector3<double> local_290;
  TVector2<double> local_278;
  DVector3 local_268;
  undefined1 local_250 [32];
  DVector3 local_230;
  TVector3<double> local_218;
  TVector2<double> local_200;
  DVector3 local_1f0;
  TVector3<double> local_1d8;
  TVector2<double> local_1c0;
  TVector2<double> local_1b0;
  DVector3 local_1a0;
  undefined1 local_188 [8];
  DVector3 pos_1;
  sector_t *sec;
  msecnode_t *pmStack_160;
  bool dopush;
  msecnode_t *node;
  TVector3<double> local_150;
  DVector3 local_138;
  DVector3 local_120;
  TVector3<double> local_108;
  TVector2<double> local_f0;
  double local_e0;
  double t;
  DVector2 dest;
  double thisplanez_1;
  F3DFloor *rover_1;
  iterator __end2;
  iterator __begin2;
  TDeletingArray<F3DFloor_*,_F3DFloor_*> *__range2;
  double local_90;
  double thisplanez;
  F3DFloor *rover;
  iterator __end1;
  iterator __begin1;
  TDeletingArray<F3DFloor_*,_F3DFloor_*> *__range1;
  double local_58;
  double planezhere;
  secplane_t *plane;
  DVector3 pos;
  DVector2 *move_local;
  AActor *actor_local;
  
  if ((P_CheckSlopeWalk(AActor*,TVector2<double>&)::copyplane == '\0') &&
     (iVar3 = __cxa_guard_acquire(&P_CheckSlopeWalk(AActor*,TVector2<double>&)::copyplane),
     iVar3 != 0)) {
    secplane_t::secplane_t(&P_CheckSlopeWalk::copyplane);
    __cxa_guard_release(&P_CheckSlopeWalk(AActor*,TVector2<double>&)::copyplane);
  }
  TFlags<ActorFlag,_unsigned_int>::operator&
            ((TFlags<ActorFlag,_unsigned_int> *)&pos.Z,
             (int)actor + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
  uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)&pos.Z);
  if (uVar4 == 0) {
    AActor::PosRelative((DVector3 *)&plane,actor,actor->floorsector);
    psVar7 = &actor->floorsector->floorplane;
    planezhere = (double)psVar7;
    TVector2<double>::TVector2((TVector2<double> *)&__range1,(TVector3<double> *)&plane);
    local_58 = secplane_t::ZatPoint(psVar7,(DVector2 *)&__range1);
    pxVar5 = &actor->floorsector->e->XFloor;
    __end1 = TArray<F3DFloor_*,_F3DFloor_*>::begin((TArray<F3DFloor_*,_F3DFloor_*> *)pxVar5);
    rover = (F3DFloor *)
            TArray<F3DFloor_*,_F3DFloor_*>::end((TArray<F3DFloor_*,_F3DFloor_*> *)pxVar5);
    while (bVar2 = TIterator<F3DFloor_*>::operator!=(&__end1,(TIterator<F3DFloor_*> *)&rover), bVar2
          ) {
      ppFVar6 = TIterator<F3DFloor_*>::operator*(&__end1);
      thisplanez = (double)*ppFVar6;
      if (((((F3DFloor *)thisplanez)->flags & 2) != 0) &&
         ((((F3DFloor *)thisplanez)->flags & 1) != 0)) {
        psVar7 = (((F3DFloor *)thisplanez)->top).plane;
        TVector2<double>::TVector2((TVector2<double> *)&__range2,(TVector3<double> *)&plane);
        dVar8 = secplane_t::ZatPoint(psVar7,(DVector2 *)&__range2);
        local_90 = dVar8;
        if ((local_58 < dVar8) && (dVar9 = AActor::Z(actor), dVar8 <= dVar9 + actor->MaxStepHeight))
        {
          secplane_t::operator=
                    (&P_CheckSlopeWalk::copyplane,*(secplane_t **)((long)thisplanez + 0x28));
          dVar8 = secplane_t::fC(&P_CheckSlopeWalk::copyplane);
          if (dVar8 < 0.0) {
            secplane_t::FlipVert(&P_CheckSlopeWalk::copyplane);
          }
          planezhere = (double)&P_CheckSlopeWalk::copyplane;
          local_58 = local_90;
        }
      }
      TIterator<F3DFloor_*>::operator++(&__end1);
    }
    if (actor->floorsector != actor->Sector) {
      pxVar5 = &actor->Sector->e->XFloor;
      __end2 = TArray<F3DFloor_*,_F3DFloor_*>::begin((TArray<F3DFloor_*,_F3DFloor_*> *)pxVar5);
      rover_1 = (F3DFloor *)
                TArray<F3DFloor_*,_F3DFloor_*>::end((TArray<F3DFloor_*,_F3DFloor_*> *)pxVar5);
      while (bVar2 = TIterator<F3DFloor_*>::operator!=(&__end2,(TIterator<F3DFloor_*> *)&rover_1),
            bVar2) {
        ppFVar6 = TIterator<F3DFloor_*>::operator*(&__end2);
        pFVar1 = *ppFVar6;
        if (((((pFVar1->flags & 2) != 0) && ((pFVar1->flags & 1) != 0)) &&
            (dVar8 = secplane_t::ZatPoint((pFVar1->top).plane,actor), dest.Y = dVar8,
            local_58 < dVar8)) && (dVar9 = AActor::Z(actor), dVar8 <= dVar9 + actor->MaxStepHeight))
        {
          secplane_t::operator=(&P_CheckSlopeWalk::copyplane,(pFVar1->top).plane);
          dVar8 = secplane_t::fC(&P_CheckSlopeWalk::copyplane);
          if (dVar8 < 0.0) {
            secplane_t::FlipVert(&P_CheckSlopeWalk::copyplane);
          }
          planezhere = (double)&P_CheckSlopeWalk::copyplane;
          local_58 = dest.Y;
        }
        TIterator<F3DFloor_*>::operator++(&__end2);
      }
    }
    if (((actor->floorsector == actor->Sector) || (local_58 <= actor->floorz + 4.0)) &&
       ((dVar8 = AActor::Z(actor), dVar8 - local_58 <= 1.0 &&
        (bVar2 = secplane_t::isSlope((secplane_t *)planezhere), bVar2)))) {
      TVector2<double>::TVector2((TVector2<double> *)&t);
      AActor::Pos(&local_120,actor);
      operator+(&local_108,&local_120,move);
      TVector2<double>::TVector2(&local_f0,&local_108);
      TVector2<double>::operator=((TVector2<double> *)&t,&local_f0);
      secplane_t::Normal(&local_138,(secplane_t *)planezhere);
      dVar8 = AActor::Z(actor);
      TVector3<double>::TVector3(&local_150,(Vector2 *)&t,dVar8);
      dVar8 = TVector3<double>::operator|(&local_138,&local_150);
      local_e0 = secplane_t::fD((secplane_t *)planezhere);
      local_e0 = dVar8 + local_e0;
      if (local_e0 < 0.0) {
        dVar8 = secplane_t::fC((secplane_t *)planezhere);
        if (0.707122802734375 <= dVar8) {
          secplane_t::Normal(&local_230,(secplane_t *)planezhere);
          operator*(&local_218,&local_230,local_e0);
          TVector2<double>::TVector2(&local_200,&local_218);
          TVector2<double>::operator-=((TVector2<double> *)&t,&local_200);
          AActor::Pos(&local_268,actor);
          TVector3<double>::XY((TVector3<double> *)local_250);
          TVector2<double>::operator-((TVector2<double> *)(local_250 + 0x10),(TVector2<double> *)&t)
          ;
          TVector2<double>::operator=(move,(TVector2<double> *)(local_250 + 0x10));
          if (actor->floorsector == actor->Sector) {
            local_330 = (secplane_t *)planezhere;
          }
          else {
            local_330 = (secplane_t *)0x0;
          }
          return local_330;
        }
        TFlags<ActorFlag,_unsigned_int>::operator&
                  ((TFlags<ActorFlag,_unsigned_int> *)((long)&node + 4),
                   (int)actor + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
        uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&node + 4));
        if (uVar4 != 0) {
          if (actor->floorsector == actor->Sector) {
            local_310 = (secplane_t *)planezhere;
          }
          else {
            local_310 = (secplane_t *)0x0;
          }
          return local_310;
        }
        bVar2 = true;
        dVar8 = secplane_t::fC((secplane_t *)planezhere);
        if (0.4714152018229167 < dVar8) {
          for (pmStack_160 = actor->touching_sectorlist; pmStack_160 != (msecnode_t *)0x0;
              pmStack_160 = pmStack_160->m_tnext) {
            pos_1.Z = (double)pmStack_160->m_sector;
            dVar8 = secplane_t::fC(&((sector_t *)pos_1.Z)->floorplane);
            if (0.707122802734375 <= dVar8) {
              AActor::PosRelative(&local_1a0,actor,(sector_t *)pos_1.Z);
              operator+((TVector3<double> *)local_188,&local_1a0,move);
              psVar7 = (secplane_t *)((long)pos_1.Z + 0xb0);
              TVector2<double>::TVector2(&local_1b0,(TVector3<double> *)local_188);
              dVar8 = secplane_t::ZatPoint(psVar7,&local_1b0);
              dVar9 = AActor::Z(actor);
              if (dVar9 - actor->MaxStepHeight <= dVar8) {
                bVar2 = false;
                break;
              }
            }
          }
        }
        if (bVar2) {
          secplane_t::Normal(&local_1f0,(secplane_t *)planezhere);
          operator*(&local_1d8,&local_1f0,2.0);
          TVector2<double>::TVector2(&local_1c0,&local_1d8);
          TVector2<double>::operator=(move,&local_1c0);
          (actor->Vel).X = move->X;
          (actor->Vel).Y = move->Y;
        }
        if (actor->floorsector == actor->Sector) {
          local_328 = (secplane_t *)planezhere;
        }
        else {
          local_328 = (secplane_t *)0x0;
        }
        return local_328;
      }
      if ((0.0 < local_e0) && (bVar2 = AActor::isAtZ(actor,local_58), bVar2)) {
        secplane_t::Normal(&local_2a8,(secplane_t *)planezhere);
        operator*(&local_290,&local_2a8,local_e0);
        TVector2<double>::TVector2(&local_278,&local_290);
        TVector2<double>::operator+=((TVector2<double> *)&t,&local_278);
        AActor::Pos(&local_2e0,actor);
        TVector3<double>::XY((TVector3<double> *)local_2c8);
        TVector2<double>::operator-((TVector2<double> *)(local_2c8 + 0x10),(TVector2<double> *)&t);
        TVector2<double>::operator=(move,(TVector2<double> *)(local_2c8 + 0x10));
        if (actor->floorsector == actor->Sector) {
          local_338 = (secplane_t *)planezhere;
        }
        else {
          local_338 = (secplane_t *)0x0;
        }
        return local_338;
      }
    }
  }
  return (secplane_t *)0x0;
}

Assistant:

const secplane_t * P_CheckSlopeWalk(AActor *actor, DVector2 &move)
{
	static secplane_t copyplane;
	if (actor->flags & MF_NOGRAVITY)
	{
		return NULL;
	}

	DVector3 pos = actor->PosRelative(actor->floorsector);
	const secplane_t *plane = &actor->floorsector->floorplane;
	double planezhere = plane->ZatPoint(pos);

	for (auto rover : actor->floorsector->e->XFloor.ffloors)
	{
		if (!(rover->flags & FF_SOLID) || !(rover->flags & FF_EXISTS)) continue;

		double thisplanez = rover->top.plane->ZatPoint(pos);

		if (thisplanez > planezhere && thisplanez <= actor->Z() + actor->MaxStepHeight)
		{
			copyplane = *rover->top.plane;
			if (copyplane.fC() < 0) copyplane.FlipVert();
			plane = &copyplane;
			planezhere = thisplanez;
		}
	}

	if (actor->floorsector != actor->Sector)
	{
		for (auto rover : actor->Sector->e->XFloor.ffloors)
		{
			if (!(rover->flags & FF_SOLID) || !(rover->flags & FF_EXISTS)) continue;

			double thisplanez = rover->top.plane->ZatPoint(actor);

			if (thisplanez > planezhere && thisplanez <= actor->Z() + actor->MaxStepHeight)
			{
				copyplane = *rover->top.plane;
				if (copyplane.fC() < 0) copyplane.FlipVert();
				plane = &copyplane;
				planezhere = thisplanez;
			}
		}
	}

	if (actor->floorsector != actor->Sector)
	{
		// this additional check prevents sliding on sloped dropoffs
		if (planezhere>actor->floorz + 4)
			return NULL;
	}

	if (actor->Z() - planezhere > 1)
	{ // not on floor
		return NULL;
	}

	if (plane->isSlope())
	{
		DVector2 dest;
		double t;

		dest = actor->Pos() + move;
		t = (plane->Normal() | DVector3(dest, actor->Z())) + plane->fD();
		if (t < 0)
		{ // Desired location is behind (below) the plane
			// (i.e. Walking up the plane)
			if (plane->fC() < STEEPSLOPE)
			{ // Can't climb up slopes of ~45 degrees or more
				if (actor->flags & MF_NOCLIP)
				{
					return (actor->floorsector == actor->Sector) ? plane : NULL;
				}
				else
				{
					const msecnode_t *node;
					bool dopush = true;

					if (plane->fC() > STEEPSLOPE * 2 / 3)
					{
						for (node = actor->touching_sectorlist; node; node = node->m_tnext)
						{
							sector_t *sec = node->m_sector;
							if (sec->floorplane.fC() >= STEEPSLOPE)
							{
								DVector3 pos = actor->PosRelative(sec) +move;

								if (sec->floorplane.ZatPoint(pos) >= actor->Z() - actor->MaxStepHeight)
								{
									dopush = false;
									break;
								}
							}
						}
					}
					if (dopush)
					{
						move = plane->Normal() * 2;
						actor->Vel.X = move.X;
						actor->Vel.Y = move.Y;
					}
					return (actor->floorsector == actor->Sector) ? plane : NULL;
				}
			}
			// Slide the desired location along the plane's normal
			// so that it lies on the plane's surface
			dest -= plane->Normal() * t;
			move = dest - actor->Pos().XY();
			return (actor->floorsector == actor->Sector) ? plane : NULL;
		}
		else if (t > 0)
		{ // Desired location is in front of (above) the plane
			if (actor->isAtZ(planezhere))	// it is very important not to be too precise here.
			{ 
				// Actor's current spot is on/in the plane, so walk down it
				// Same principle as walking up, except reversed
				dest += plane->Normal() * t;
				move = dest - actor->Pos().XY();
				return (actor->floorsector == actor->Sector) ? plane : NULL;
			}
		}
	}
	return NULL;
}